

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall Vault::ConfigBuilder::~ConfigBuilder(ConfigBuilder *this)

{
  ConfigBuilder *this_local;
  
  Config::~Config(&this->config_);
  return;
}

Assistant:

explicit operator Config &&() { return std::move(config_); }